

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  TargetType TVar1;
  char *pcVar2;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  char *local_60;
  char *tversion;
  allocator local_41;
  string local_40;
  char *local_20;
  char *fversion;
  cmGeneratorTarget *this_local;
  
  fversion = (char *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  TVar1 = GetType(this);
  if (TVar1 != INTERFACE_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"FRAMEWORK_VERSION",&local_41);
    pcVar2 = GetProperty(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"VERSION",&local_81);
      pcVar2 = GetProperty(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_60 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"A",&local_83);
        std::allocator<char>::~allocator((allocator<char> *)&local_83);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_82);
        std::allocator<char>::~allocator((allocator<char> *)&local_82);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar2,(allocator *)((long)&tversion + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&tversion + 3));
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->GetType() != cmState::INTERFACE_LIBRARY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x11d7,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != cmState::INTERFACE_LIBRARY);

  if(const char* fversion = this->GetProperty("FRAMEWORK_VERSION"))
    {
    return fversion;
    }
  else if(const char* tversion = this->GetProperty("VERSION"))
    {
    return tversion;
    }
  else
    {
    return "A";
    }
}